

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

Builder * __thiscall
capnp::Orphan<capnp::DynamicStruct>::get
          (Builder *__return_storage_ptr__,Orphan<capnp::DynamicStruct> *this)

{
  StructBuilder builder;
  StructSize size;
  StructBuilder local_40;
  Schema local_18;
  Orphan<capnp::DynamicStruct> *local_10;
  Orphan<capnp::DynamicStruct> *this_local;
  
  local_18.raw = (this->schema).super_Schema.raw;
  local_10 = this;
  size = anon_unknown_70::structSizeFromSchema((StructSchema)(this->schema).super_Schema.raw);
  capnp::_::OrphanBuilder::asStruct(&local_40,&this->builder,size);
  builder.capTable = local_40.capTable;
  builder.segment = local_40.segment;
  builder.data = local_40.data;
  builder.pointers = local_40.pointers;
  builder.dataSize = local_40.dataSize;
  builder.pointerCount = local_40.pointerCount;
  builder._38_2_ = local_40._38_2_;
  DynamicStruct::Builder::Builder(__return_storage_ptr__,(StructSchema)local_18.raw,builder);
  return __return_storage_ptr__;
}

Assistant:

DynamicStruct::Builder Orphan<DynamicStruct>::get() {
  return DynamicStruct::Builder(schema, builder.asStruct(structSizeFromSchema(schema)));
}